

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5PorterCb(void *pCtx,int tflags,char *pToken,int nToken,int iStart,int iEnd)

{
  char *pcVar1;
  int *piVar2;
  char cVar3;
  bool bVar4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  code *UNRECOVERED_JUMPTABLE;
  byte bVar9;
  ulong uVar10;
  short *psVar11;
  ulong uVar12;
  char *zStem;
  int nBuf;
  uint nStem;
  uint uVar13;
  int nBuf_1;
  undefined4 in_register_00000034;
  byte bVar14;
  undefined8 uVar15;
  undefined4 in_register_00000084;
  ulong uVar16;
  
  uVar12 = CONCAT44(in_register_00000084,iStart);
  uVar10 = CONCAT44(in_register_00000034,tflags);
  if (nToken - 0x41U < 0xffffffc2) {
    uVar15 = *pCtx;
    UNRECOVERED_JUMPTABLE = *(code **)((long)pCtx + 8);
    uVar16 = (ulong)(uint)nToken;
    zStem = pToken;
    goto LAB_001c6cf2;
  }
  zStem = *(char **)((long)pCtx + 0x10);
  uVar10 = (ulong)(uint)nToken;
  memcpy(zStem,pToken,uVar10);
  uVar13 = nToken;
  if (((zStem[(long)nToken + -1] == 's') && (zStem[(long)nToken + -2] != 's')) &&
     ((zStem[(long)nToken + -2] != 'e' ||
      ((((uVar13 = nToken - 2, nToken < 5 || (zStem[uVar10 - 4] != 's')) ||
        (zStem[uVar10 - 3] != 's')) && ((nToken < 4 || (zStem[uVar10 - 3] != 'i')))))))) {
    uVar13 = nToken - 1;
  }
  bVar4 = true;
  if (zStem[(long)(int)uVar13 + -2] == 'n') {
    if ((3 < (int)uVar13) &&
       (uVar16 = (ulong)(uVar13 - 3),
       zStem[uVar16 + 2] == 'g' && *(short *)(zStem + uVar16) == 0x6e69)) {
      uVar10 = 0;
      do {
        bVar14 = zStem[uVar10] + 0x9f;
        bVar14 = bVar14 >> 1 | bVar14 * -0x80;
        if (((bVar14 < 0xb) && ((0x495U >> (bVar14 & 0x1f) & 1) != 0)) ||
           (zStem[uVar10] == 'y' && uVar10 != 0)) goto LAB_001c619f;
        uVar10 = uVar10 + 1;
      } while (uVar16 != uVar10);
    }
  }
  else if (zStem[(long)(int)uVar13 + -2] == 'e') {
    if (3 < (int)uVar13) {
      nStem = uVar13 - 3;
      if (zStem[(ulong)nStem + 2] == 'd' && *(short *)(zStem + nStem) == 0x6565) {
        iVar7 = fts5PorterGobbleVC(zStem,nStem,0);
        if (iVar7 != 0) {
          (zStem + nStem)[0] = 'e';
          (zStem + nStem)[1] = 'e';
          uVar13 = uVar13 - 1;
        }
        goto LAB_001c61bd;
      }
    }
    if ((2 < (int)uVar13) && (uVar16 = (long)(int)uVar13 - 2, *(short *)(zStem + uVar16) == 0x6465))
    {
      uVar10 = 0;
      do {
        bVar14 = zStem[uVar10] + 0x9f;
        bVar14 = bVar14 >> 1 | bVar14 * -0x80;
        if (((bVar14 < 0xb) && ((0x495U >> (bVar14 & 0x1f) & 1) != 0)) ||
           (zStem[uVar10] == 'y' && uVar10 != 0)) goto LAB_001c619f;
        uVar10 = uVar10 + 1;
      } while ((uVar16 & 0xffffffff) != uVar10);
    }
  }
LAB_001c61bd:
  uVar16 = (ulong)uVar13;
  goto LAB_001c61c0;
LAB_001c619f:
  bVar4 = false;
LAB_001c61c0:
  if (!bVar4) {
    iVar7 = (int)uVar16;
    pcVar1 = zStem + iVar7;
    psVar11 = (short *)(pcVar1 + -2);
    cVar3 = (char)*psVar11;
    bVar4 = true;
    if (cVar3 == 'i') {
      if ((2 < iVar7) && (*psVar11 == 0x7a69)) {
        *pcVar1 = 'e';
        *psVar11 = 0x7a69;
        goto LAB_001c622e;
      }
    }
    else if (cVar3 == 'b') {
      if ((2 < iVar7) && (*psVar11 == 0x6c62)) {
        *pcVar1 = 'e';
        *psVar11 = 0x6c62;
        goto LAB_001c622e;
      }
    }
    else if (((cVar3 == 'a') && (2 < iVar7)) && (*psVar11 == 0x7461)) {
      *pcVar1 = 'e';
      *psVar11 = 0x7461;
LAB_001c622e:
      uVar16 = (ulong)(iVar7 + 1);
      bVar4 = false;
    }
    if (bVar4) {
      iVar7 = (int)uVar16;
      bVar14 = zStem[(long)iVar7 + -1];
      bVar9 = (byte)(bVar14 + 0x9f) >> 1 | (bVar14 + 0x9f) * -0x80;
      if ((((bVar9 < 0xb) && ((0x495U >> (bVar9 & 0x1f) & 1) != 0)) ||
          ((bVar14 - 0x6c < 0xf && ((0x4081U >> (bVar14 - 0x6c & 0x1f) & 1) != 0)))) ||
         (bVar14 != zStem[(long)iVar7 + -2])) {
        iVar6 = fts5Porter_MEq1(zStem,iVar7);
        if ((iVar6 != 0) && (iVar6 = fts5Porter_Ostar(zStem,iVar7), iVar6 != 0)) {
          uVar16 = (ulong)(iVar7 + 1);
          zStem[iVar7] = 'e';
        }
      }
      else {
        uVar16 = (ulong)(iVar7 - 1);
      }
    }
  }
  iVar7 = (int)uVar16;
  lVar8 = (long)iVar7;
  if ((1 < iVar7) && (zStem[lVar8 + -1] == 'y')) {
    uVar10 = 0;
    do {
      bVar14 = zStem[uVar10] + 0x9f;
      bVar14 = bVar14 >> 1 | bVar14 * -0x80;
      if (((bVar14 < 0xb) && ((0x495U >> (bVar14 & 0x1f) & 1) != 0)) ||
         (zStem[uVar10] == 'y' && uVar10 != 0)) {
        zStem[(uVar16 & 0xffffffff) - 1] = 'i';
        break;
      }
      uVar10 = uVar10 + 1;
    } while ((lVar8 - 1U & 0xffffffff) != uVar10);
  }
  switch(zStem[lVar8 + -2]) {
  case 'a':
    if (7 < iVar7) {
      uVar13 = iVar7 - 7;
      if (*(int *)(zStem + (ulong)uVar13 + 3) == 0x6c616e6f &&
          *(int *)(zStem + uVar13) == 0x6f697461) {
        iVar6 = fts5PorterGobbleVC(zStem,uVar13,0);
        if (iVar6 == 0) break;
        pcVar1 = zStem + uVar13;
        pcVar1[2] = 'e';
        pcVar1[0] = 'a';
        pcVar1[1] = 't';
        goto LAB_001c6895;
      }
    }
    if (6 < iVar7) {
      uVar13 = iVar7 - 6;
      if ((*(short *)(zStem + (ulong)uVar13 + 4) == 0x6c61 && *(int *)(zStem + uVar13) == 0x6e6f6974
          ) && (iVar6 = fts5PorterGobbleVC(zStem,uVar13,0), iVar6 != 0)) {
        builtin_strncpy(zStem + uVar13,"tion",4);
LAB_001c6878:
        uVar16 = (ulong)(iVar7 - 2);
      }
    }
    break;
  case 'c':
    if (4 < iVar7) {
      uVar13 = iVar7 - 4;
      if (*(int *)(zStem + uVar13) == 0x69636e65) {
        iVar7 = fts5PorterGobbleVC(zStem,uVar13,0);
        if (iVar7 != 0) {
          builtin_strncpy(zStem + uVar13,"ence",4);
        }
      }
      else if ((*(int *)(zStem + uVar13) == 0x69636e61) &&
              (iVar7 = fts5PorterGobbleVC(zStem,uVar13,0), iVar7 != 0)) {
        builtin_strncpy(zStem + uVar13,"ance",4);
      }
    }
    break;
  case 'e':
    if (4 < iVar7) {
      uVar13 = iVar7 - 4;
      if ((*(int *)(zStem + uVar13) == 0x72657a69) &&
         (iVar7 = fts5PorterGobbleVC(zStem,uVar13,0), iVar7 != 0)) {
        pcVar1 = zStem + uVar13;
        pcVar1[2] = 'e';
        pcVar1[0] = 'i';
        pcVar1[1] = 'z';
LAB_001c65f5:
        uVar16 = lVar8 - 1U & 0xffffffff;
      }
    }
    break;
  case 'g':
    if (4 < iVar7) {
      uVar13 = iVar7 - 4;
      if ((*(int *)(zStem + uVar13) == 0x69676f6c) &&
         (iVar7 = fts5PorterGobbleVC(zStem,uVar13,0), iVar7 != 0)) {
        pcVar1 = zStem + uVar13;
        pcVar1[2] = 'g';
        pcVar1[0] = 'l';
        pcVar1[1] = 'o';
        goto LAB_001c65f5;
      }
    }
    break;
  case 'l':
    if (3 < iVar7) {
      uVar13 = iVar7 - 3;
      if (zStem[(ulong)uVar13 + 2] == 'i' && *(short *)(zStem + uVar13) == 0x6c62) {
        iVar7 = fts5PorterGobbleVC(zStem,uVar13,0);
        if (iVar7 != 0) {
          pcVar1 = zStem + uVar13;
          pcVar1[2] = 'e';
          pcVar1[0] = 'b';
          pcVar1[1] = 'l';
        }
        break;
      }
    }
    if (4 < iVar7) {
      uVar13 = iVar7 - 4;
      if (*(int *)(zStem + uVar13) == 0x696c6c61) {
        iVar6 = fts5PorterGobbleVC(zStem,uVar13,0);
        if (iVar6 != 0) {
          (zStem + uVar13)[0] = 'a';
          (zStem + uVar13)[1] = 'l';
          goto LAB_001c6878;
        }
        break;
      }
    }
    if (5 < iVar7) {
      uVar13 = iVar7 - 5;
      if (zStem[(ulong)uVar13 + 4] == 'i' && *(int *)(zStem + uVar13) == 0x6c746e65) {
        iVar6 = fts5PorterGobbleVC(zStem,uVar13,0);
        if (iVar6 != 0) {
          pcVar1 = zStem + uVar13;
          pcVar1[2] = 't';
          pcVar1[0] = 'e';
          pcVar1[1] = 'n';
          goto LAB_001c6878;
        }
        break;
      }
    }
    if (3 < iVar7) {
      uVar13 = iVar7 - 3;
      if (zStem[(ulong)uVar13 + 2] == 'i' && *(short *)(zStem + uVar13) == 0x6c65) {
        iVar6 = fts5PorterGobbleVC(zStem,uVar13,0);
        if (iVar6 != 0) {
          zStem[uVar13] = 'e';
          goto LAB_001c6878;
        }
        break;
      }
    }
    if (5 < iVar7) {
      uVar13 = iVar7 - 5;
      if ((zStem[(ulong)uVar13 + 4] == 'i' && *(int *)(zStem + uVar13) == 0x6c73756f) &&
         (iVar6 = fts5PorterGobbleVC(zStem,uVar13,0), iVar6 != 0)) {
        pcVar1 = zStem + uVar13;
        pcVar1[2] = 's';
        pcVar1[0] = 'o';
        pcVar1[1] = 'u';
        goto LAB_001c6878;
      }
    }
    break;
  case 'o':
    if (7 < iVar7) {
      uVar13 = iVar7 - 7;
      if (*(int *)(zStem + (ulong)uVar13 + 3) == 0x6e6f6974 &&
          *(int *)(zStem + uVar13) == 0x74617a69) {
        iVar6 = fts5PorterGobbleVC(zStem,uVar13,0);
        if (iVar6 != 0) {
          pcVar1 = zStem + uVar13;
          pcVar1[2] = 'e';
          pcVar1[0] = 'i';
          pcVar1[1] = 'z';
          goto LAB_001c6895;
        }
        break;
      }
    }
    if (5 < iVar7) {
      uVar13 = iVar7 - 5;
      if (zStem[(ulong)uVar13 + 4] == 'n' && *(int *)(zStem + uVar13) == 0x6f697461) {
        iVar6 = fts5PorterGobbleVC(zStem,uVar13,0);
        if (iVar6 != 0) {
          pcVar1 = zStem + uVar13;
          pcVar1[2] = 'e';
          pcVar1[0] = 'a';
          pcVar1[1] = 't';
          goto LAB_001c6878;
        }
        break;
      }
    }
    if (4 < iVar7) {
      uVar13 = iVar7 - 4;
      if ((*(int *)(zStem + uVar13) == 0x726f7461) &&
         (iVar7 = fts5PorterGobbleVC(zStem,uVar13,0), iVar7 != 0)) {
        pcVar1 = zStem + uVar13;
        pcVar1[2] = 'e';
        pcVar1[0] = 'a';
        pcVar1[1] = 't';
        goto LAB_001c65f5;
      }
    }
    break;
  case 's':
    if (5 < iVar7) {
      uVar13 = iVar7 - 5;
      if (zStem[(ulong)uVar13 + 4] == 'm' && *(int *)(zStem + uVar13) == 0x73696c61) {
        iVar6 = fts5PorterGobbleVC(zStem,uVar13,0);
        if (iVar6 == 0) break;
        (zStem + uVar13)[0] = 'a';
        (zStem + uVar13)[1] = 'l';
LAB_001c6777:
        uVar16 = (ulong)(iVar7 - 3);
        break;
      }
    }
    if (7 < iVar7) {
      uVar13 = iVar7 - 7;
      piVar2 = (int *)(zStem + uVar13);
      if (*(int *)(zStem + (ulong)uVar13 + 3) == 0x7373656e &&
          *(int *)(zStem + uVar13) == 0x6e657669) {
        iVar6 = fts5PorterGobbleVC(zStem,uVar13,0);
        if (iVar6 != 0) {
          *(undefined1 *)((long)piVar2 + 2) = 0x65;
          *(undefined2 *)piVar2 = 0x7669;
          goto LAB_001c6895;
        }
      }
      else if (*(int *)((long)piVar2 + 3) == 0x7373656e && *piVar2 == 0x6e6c7566) {
        iVar6 = fts5PorterGobbleVC(zStem,uVar13,0);
        if (iVar6 != 0) {
          *(undefined1 *)((long)piVar2 + 2) = 0x6c;
          *(undefined2 *)piVar2 = 0x7566;
          goto LAB_001c6895;
        }
      }
      else if ((*(int *)((long)piVar2 + 3) == 0x7373656e && *piVar2 == 0x6e73756f) &&
              (iVar6 = fts5PorterGobbleVC(zStem,uVar13,0), iVar6 != 0)) {
        *(undefined1 *)((long)piVar2 + 2) = 0x73;
        *(undefined2 *)piVar2 = 0x756f;
LAB_001c6895:
        uVar16 = (ulong)(iVar7 - 4);
      }
    }
    break;
  case 't':
    if (iVar7 < 6) {
LAB_001c6528:
      if (6 < iVar7) {
        uVar13 = iVar7 - 6;
        if ((*(short *)(zStem + (ulong)uVar13 + 4) == 0x6974 &&
             *(int *)(zStem + uVar13) == 0x696c6962) &&
           (iVar6 = fts5PorterGobbleVC(zStem,uVar13,0), iVar6 != 0)) {
          pcVar1 = zStem + uVar13;
          pcVar1[2] = 'e';
          pcVar1[0] = 'b';
          pcVar1[1] = 'l';
          goto LAB_001c6777;
        }
      }
    }
    else {
      uVar13 = iVar7 - 5;
      piVar2 = (int *)(zStem + uVar13);
      if (zStem[(ulong)uVar13 + 4] != 'i' || *(int *)(zStem + uVar13) != 0x74696c61) {
        if ((char)piVar2[1] != 'i' || *piVar2 != 0x74697669) goto LAB_001c6528;
        iVar6 = fts5PorterGobbleVC(zStem,uVar13,0);
        if (iVar6 == 0) break;
        *(undefined1 *)((long)piVar2 + 2) = 0x65;
        *(undefined2 *)piVar2 = 0x7669;
        goto LAB_001c6878;
      }
      iVar6 = fts5PorterGobbleVC(zStem,uVar13,0);
      if (iVar6 != 0) {
        *(undefined2 *)piVar2 = 0x6c61;
        goto LAB_001c6777;
      }
    }
  }
  iVar7 = (int)uVar16;
  switch(zStem[(long)iVar7 + -2]) {
  case 's':
    if ((4 < iVar7) && (uVar10 = (ulong)(iVar7 - 4), *(int *)(zStem + uVar10) == 0x7373656e)) {
LAB_001c6a10:
      iVar7 = fts5PorterGobbleVC(zStem,(int)uVar10,0);
      uVar16 = uVar16 & 0xffffffff;
      if (iVar7 != 0) {
        uVar16 = uVar10;
      }
    }
    break;
  case 't':
    if (5 < iVar7) {
      uVar13 = iVar7 - 5;
      if (((zStem[(ulong)uVar13 + 4] == 'e' && *(int *)(zStem + uVar13) == 0x74616369) ||
          (zStem[(ulong)uVar13 + 4] == 'i' && *(int *)(zStem + uVar13) == 0x74696369)) &&
         (iVar6 = fts5PorterGobbleVC(zStem,uVar13,0), iVar6 != 0)) {
        (zStem + uVar13)[0] = 'i';
        (zStem + uVar13)[1] = 'c';
LAB_001c69ea:
        uVar16 = (ulong)(iVar7 - 3);
      }
    }
    break;
  case 'u':
    if ((3 < iVar7) &&
       (uVar10 = (ulong)(iVar7 - 3),
       zStem[uVar10 + 2] == 'l' && *(short *)(zStem + uVar10) == 0x7566)) goto LAB_001c6a10;
    break;
  case 'v':
    if ((5 < iVar7) &&
       (uVar10 = (ulong)(iVar7 - 5),
       zStem[uVar10 + 4] == 'e' && *(int *)(zStem + uVar10) == 0x76697461)) goto LAB_001c6a10;
    break;
  case 'w':
  case 'x':
  case 'y':
    break;
  case 'z':
    if (5 < iVar7) {
      uVar13 = iVar7 - 5;
      if ((zStem[(ulong)uVar13 + 4] == 'e' && *(int *)(zStem + uVar13) == 0x7a696c61) &&
         (iVar6 = fts5PorterGobbleVC(zStem,uVar13,0), iVar6 != 0)) {
        (zStem + uVar13)[0] = 'a';
        (zStem + uVar13)[1] = 'l';
        goto LAB_001c69ea;
      }
    }
    break;
  default:
    if ((zStem[(long)iVar7 + -2] == 'a') && (4 < iVar7)) {
      uVar13 = iVar7 - 4;
      if ((*(int *)(zStem + uVar13) == 0x6c616369) &&
         (iVar6 = fts5PorterGobbleVC(zStem,uVar13,0), iVar6 != 0)) {
        (zStem + uVar13)[0] = 'i';
        (zStem + uVar13)[1] = 'c';
        uVar16 = (ulong)(iVar7 - 2);
      }
    }
  }
  iVar7 = (int)uVar16;
  lVar8 = (long)iVar7;
  if ((byte)zStem[lVar8 + -2] - 0x61 < 0x1a) {
    uVar10 = lVar8 - 2;
    switch((uint)(byte)zStem[lVar8 + -2]) {
    case 0x61:
      if ((2 < iVar7) && (*(short *)(zStem + uVar10) == 0x6c61)) {
LAB_001c6c7e:
        iVar7 = fts5Porter_MGt1(zStem,(int)uVar10);
        uVar16 = uVar16 & 0xffffffff;
        if (iVar7 != 0) {
          uVar16 = uVar10 & 0xffffffff;
        }
      }
      break;
    case 99:
      if ((4 < iVar7) &&
         ((uVar10 = (ulong)(iVar7 - 4), *(int *)(zStem + uVar10) == 0x65636e61 ||
          (*(int *)(zStem + uVar10) == 0x65636e65)))) goto LAB_001c6c7e;
      break;
    case 0x65:
      if ((2 < iVar7) && (*(short *)(zStem + uVar10) == 0x7265)) goto LAB_001c6c7e;
      break;
    case 0x69:
      if ((2 < iVar7) && (*(short *)(zStem + uVar10) == 0x6369)) goto LAB_001c6c7e;
      break;
    case 0x6c:
      if ((4 < iVar7) &&
         ((uVar10 = (ulong)(iVar7 - 4), *(int *)(zStem + uVar10) == 0x656c6261 ||
          (*(int *)(zStem + uVar10) == 0x656c6269)))) goto LAB_001c6c7e;
      break;
    case 0x6e:
      if ((((3 < iVar7) &&
           (uVar10 = (ulong)(iVar7 - 3),
           zStem[uVar10 + 2] == 't' && *(short *)(zStem + uVar10) == 0x6e61)) ||
          ((5 < iVar7 &&
           (uVar10 = (ulong)(iVar7 - 5),
           zStem[uVar10 + 4] == 't' && *(int *)(zStem + uVar10) == 0x6e656d65)))) ||
         ((4 < iVar7 && (uVar10 = (ulong)(iVar7 - 4), *(int *)(zStem + uVar10) == 0x746e656d))))
      goto LAB_001c6c7e;
      if (3 < iVar7) {
        uVar10 = (ulong)(iVar7 - 3);
        uVar5 = *(ushort *)(zStem + uVar10) ^ 0x6e65;
        bVar14 = zStem[uVar10 + 2] ^ 0x74;
        goto LAB_001c6c79;
      }
      break;
    case 0x6f:
      if ((iVar7 < 4) ||
         (uVar12 = lVar8 - 3U & 0xffffffff,
         zStem[uVar12 + 2] != 'n' || *(short *)(zStem + uVar12) != 0x6f69)) {
        if ((2 < iVar7) && (*(short *)(zStem + uVar10) == 0x756f)) goto LAB_001c6c7e;
      }
      else {
        uVar10 = lVar8 - 3U & 0xffffffff;
        if ((byte)(zStem[lVar8 + -4] + 0x8dU) < 2) goto LAB_001c6c7e;
      }
      break;
    case 0x73:
      if (3 < iVar7) {
        uVar10 = (ulong)(iVar7 - 3);
        uVar5 = *(ushort *)(zStem + uVar10) ^ 0x7369;
        bVar14 = zStem[uVar10 + 2] ^ 0x6d;
LAB_001c6c79:
        if (bVar14 == 0 && uVar5 == 0) goto LAB_001c6c7e;
      }
      break;
    case 0x74:
      if (3 < iVar7) {
        uVar10 = (ulong)(iVar7 - 3);
        if (zStem[uVar10 + 2] != 'e' || *(short *)(zStem + uVar10) != 0x7461) {
          uVar5 = *(ushort *)(zStem + uVar10) ^ 0x7469;
          bVar14 = zStem[uVar10 + 2] ^ 0x69;
          goto LAB_001c6c79;
        }
        goto LAB_001c6c7e;
      }
      break;
    case 0x75:
      if (3 < iVar7) {
        uVar10 = (ulong)(iVar7 - 3);
        uVar5 = *(ushort *)(zStem + uVar10) ^ 0x756f;
        bVar14 = zStem[uVar10 + 2] ^ 0x73;
        goto LAB_001c6c79;
      }
      break;
    case 0x76:
      if (3 < iVar7) {
        uVar10 = (ulong)(iVar7 - 3);
        uVar5 = *(ushort *)(zStem + uVar10) ^ 0x7669;
LAB_001c6b40:
        bVar14 = zStem[uVar10 + 2] ^ 0x65;
        goto LAB_001c6c79;
      }
      break;
    case 0x7a:
      if (3 < iVar7) {
        uVar10 = (ulong)(iVar7 - 3);
        uVar5 = *(ushort *)(zStem + uVar10) ^ 0x7a69;
        goto LAB_001c6b40;
      }
    }
  }
  if (zStem[(long)(int)uVar16 + -1] == 'e') {
    uVar10 = (long)(int)uVar16 - 1;
    iVar6 = (int)uVar10;
    iVar7 = fts5Porter_MGt1(zStem,iVar6);
    if ((iVar7 != 0) ||
       ((iVar7 = fts5Porter_MEq1(zStem,iVar6), iVar7 != 0 &&
        (iVar7 = fts5Porter_Ostar(zStem,iVar6), iVar7 == 0)))) {
      uVar16 = uVar10 & 0xffffffff;
    }
  }
  if (((1 < (int)uVar16) && (uVar13 = (int)uVar16 - 1, zStem[uVar13] == 'l')) &&
     (zStem[(uVar16 & 0xffffffff) - 2] == 'l')) {
    iVar7 = fts5Porter_MGt1(zStem,uVar13);
    uVar16 = uVar16 & 0xffffffff;
    if (iVar7 != 0) {
      uVar16 = (ulong)uVar13;
    }
  }
  uVar15 = *pCtx;
  UNRECOVERED_JUMPTABLE = *(code **)((long)pCtx + 8);
  uVar10 = (ulong)(uint)tflags;
  uVar16 = uVar16 & 0xffffffff;
  uVar12 = (ulong)(uint)iStart;
LAB_001c6cf2:
  iVar7 = (*UNRECOVERED_JUMPTABLE)(uVar15,uVar10,zStem,uVar16,uVar12,iEnd);
  return iVar7;
}

Assistant:

static int fts5PorterCb(
  void *pCtx, 
  int tflags,
  const char *pToken, 
  int nToken, 
  int iStart, 
  int iEnd
){
  PorterContext *p = (PorterContext*)pCtx;

  char *aBuf;
  int nBuf;

  if( nToken>FTS5_PORTER_MAX_TOKEN || nToken<3 ) goto pass_through;
  aBuf = p->aBuf;
  nBuf = nToken;
  memcpy(aBuf, pToken, nBuf);

  /* Step 1. */
  fts5PorterStep1A(aBuf, &nBuf);
  if( fts5PorterStep1B(aBuf, &nBuf) ){
    if( fts5PorterStep1B2(aBuf, &nBuf)==0 ){
      char c = aBuf[nBuf-1];
      if( fts5PorterIsVowel(c, 0)==0 
       && c!='l' && c!='s' && c!='z' && c==aBuf[nBuf-2] 
      ){
        nBuf--;
      }else if( fts5Porter_MEq1(aBuf, nBuf) && fts5Porter_Ostar(aBuf, nBuf) ){
        aBuf[nBuf++] = 'e';
      }
    }
  }

  /* Step 1C. */
  if( aBuf[nBuf-1]=='y' && fts5Porter_Vowel(aBuf, nBuf-1) ){
    aBuf[nBuf-1] = 'i';
  }

  /* Steps 2 through 4. */
  fts5PorterStep2(aBuf, &nBuf);
  fts5PorterStep3(aBuf, &nBuf);
  fts5PorterStep4(aBuf, &nBuf);

  /* Step 5a. */
  assert( nBuf>0 );
  if( aBuf[nBuf-1]=='e' ){
    if( fts5Porter_MGt1(aBuf, nBuf-1) 
     || (fts5Porter_MEq1(aBuf, nBuf-1) && !fts5Porter_Ostar(aBuf, nBuf-1))
    ){
      nBuf--;
    }
  }

  /* Step 5b. */
  if( nBuf>1 && aBuf[nBuf-1]=='l' 
   && aBuf[nBuf-2]=='l' && fts5Porter_MGt1(aBuf, nBuf-1) 
  ){
    nBuf--;
  }

  return p->xToken(p->pCtx, tflags, aBuf, nBuf, iStart, iEnd);

 pass_through:
  return p->xToken(p->pCtx, tflags, pToken, nToken, iStart, iEnd);
}